

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void free_parser_working_data(Parser *p)

{
  uint32 *puVar1;
  PNode **__ptr;
  SNode **__ptr_00;
  Reduction *pRVar2;
  SNode *pSVar3;
  Shift *pSVar4;
  Reduction *pRVar5;
  Shift *pSVar6;
  PNode *pPVar7;
  SNode *pSVar8;
  D_Reduction **__ptr_01;
  PNode *pPVar9;
  ulong uVar10;
  
  free_old_nodes(p);
  free_old_nodes(p);
  __ptr = (p->pnode_hash).v;
  if (__ptr != (PNode **)0x0) {
    free(__ptr);
  }
  __ptr_00 = (p->snode_hash).v;
  if (__ptr_00 != (SNode **)0x0) {
    free(__ptr_00);
  }
  *(undefined8 *)&(p->snode_hash).n = 0;
  (p->snode_hash).all = (SNode *)0x0;
  (p->snode_hash).v = (SNode **)0x0;
  (p->snode_hash).i = 0;
  (p->snode_hash).m = 0;
  *(undefined8 *)&(p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  (p->pnode_hash).v = (PNode **)0x0;
  (p->pnode_hash).i = 0;
  (p->pnode_hash).m = 0;
  (p->snode_hash).last_all = (SNode *)0x0;
  while (p->reductions_todo != (Reduction *)0x0) {
    pRVar2 = p->free_reductions->next;
    pSVar3 = p->reductions_todo->snode;
    puVar1 = &pSVar3->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar3);
    }
    free(p->free_reductions);
    p->free_reductions = pRVar2;
  }
  while (p->shifts_todo != (Shift *)0x0) {
    pSVar4 = p->free_shifts->next;
    pSVar3 = p->shifts_todo->snode;
    puVar1 = &pSVar3->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar3);
    }
    free(p->free_shifts);
    p->free_shifts = pSVar4;
  }
  pRVar2 = p->free_reductions;
  while (pRVar2 != (Reduction *)0x0) {
    pRVar5 = pRVar2->next;
    free(pRVar2);
    p->free_reductions = pRVar5;
    pRVar2 = pRVar5;
  }
  pSVar4 = p->free_shifts;
  while (pSVar4 != (Shift *)0x0) {
    pSVar6 = pSVar4->next;
    free(pSVar4);
    p->free_shifts = pSVar6;
    pSVar4 = pSVar6;
  }
  pPVar9 = p->free_pnodes;
  while (pPVar9 != (PNode *)0x0) {
    pPVar7 = pPVar9->all_next;
    free(pPVar9);
    p->free_pnodes = pPVar7;
    pPVar9 = pPVar7;
  }
  pPVar9 = (PNode *)p->free_znodes;
  while (pPVar9 != (PNode *)0x0) {
    pPVar7 = *(PNode **)&pPVar9->hash;
    free(pPVar9);
    p->free_znodes = (ZNode *)pPVar7;
    pPVar9 = pPVar7;
  }
  pSVar3 = p->free_snodes;
  while (pSVar3 != (SNode *)0x0) {
    pSVar8 = pSVar3->all_next;
    free(pSVar3);
    p->free_snodes = pSVar8;
    pSVar3 = pSVar8;
  }
  if ((p->error_reductions).n != 0) {
    uVar10 = 0;
    do {
      free((p->error_reductions).v[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (p->error_reductions).n);
  }
  __ptr_01 = (p->error_reductions).v;
  if (__ptr_01 != (p->error_reductions).e && __ptr_01 != (D_Reduction **)0x0) {
    free(__ptr_01);
  }
  (p->error_reductions).n = 0;
  (p->error_reductions).v = (D_Reduction **)0x0;
  if (p->whitespace_parser != (Parser *)0x0) {
    free_parser_working_data(p->whitespace_parser);
  }
  free(p->shift_results);
  p->shift_results = (ShiftResult *)0x0;
  p->nshift_results = 0;
  free(p->code_shifts);
  p->code_shifts = (D_Shift *)0x0;
  p->ncode_shifts = 0;
  return;
}

Assistant:

static void free_parser_working_data(Parser *p) {
  uint i;

  free_old_nodes(p);
  free_old_nodes(p); /* to catch SNodes saved for error repair */
  if (p->pnode_hash.v) FREE(p->pnode_hash.v);
  if (p->snode_hash.v) FREE(p->snode_hash.v);
  memset(&p->pnode_hash, 0, sizeof(p->pnode_hash));
  memset(&p->snode_hash, 0, sizeof(p->snode_hash));
  while (p->reductions_todo) {
    Reduction *r = p->free_reductions->next;
    unref_sn(p, p->reductions_todo->snode);
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->shifts_todo) {
    Shift *s = p->free_shifts->next;
    unref_sn(p, p->shifts_todo->snode);
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_reductions) {
    Reduction *r = p->free_reductions->next;
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->free_shifts) {
    Shift *s = p->free_shifts->next;
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_pnodes) {
    PNode *pn = p->free_pnodes->all_next;
    FREE(p->free_pnodes);
    p->free_pnodes = pn;
  }
  while (p->free_znodes) {
    ZNode *zn = znode_next(p->free_znodes);
    FREE(p->free_znodes);
    p->free_znodes = zn;
  }
  while (p->free_snodes) {
    SNode *sn = p->free_snodes->all_next;
    FREE(p->free_snodes);
    p->free_snodes = sn;
  }
  for (i = 0; i < p->error_reductions.n; i++) FREE(p->error_reductions.v[i]);
  vec_free(&p->error_reductions);
  if (p->whitespace_parser) free_parser_working_data(p->whitespace_parser);
  FREE(p->shift_results);
  p->shift_results = NULL;
  p->nshift_results = 0;
  FREE(p->code_shifts);
  p->code_shifts = NULL;
  p->ncode_shifts = 0;
}